

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O3

void __thiscall QToolBar::actionEvent(QToolBar *this,QActionEvent *event)

{
  short sVar1;
  long lVar2;
  QAction *action;
  int iVar3;
  QObject *pQVar4;
  long *plVar5;
  
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  action = *(QAction **)(event + 0x10);
  pQVar4 = (QObject *)QMetaObject::cast((QObject *)&QWidgetAction::staticMetaObject);
  sVar1 = *(short *)(event + 8);
  if (sVar1 == 0x71) {
    (**(code **)(**(long **)(lVar2 + 0x278) + 0x70))();
    return;
  }
  if (sVar1 == 0x73) {
    iVar3 = QToolBarLayout::indexOf(*(QToolBarLayout **)(lVar2 + 0x278),action);
    if (iVar3 != -1) {
      plVar5 = (long *)(**(code **)(**(long **)(lVar2 + 0x278) + 0xb0))
                                 (*(long **)(lVar2 + 0x278),iVar3);
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 8))(plVar5);
        return;
      }
    }
  }
  else if (sVar1 == 0x72) {
    if ((pQVar4 != (QObject *)0x0) && ((*(byte *)(*(long *)(pQVar4 + 8) + 0x1d0) & 2) != 0)) {
      QObject::setParent(pQVar4);
    }
    iVar3 = (**(code **)(**(long **)(lVar2 + 0x278) + 200))();
    if (*(QAction **)(event + 0x18) != (QAction *)0x0) {
      iVar3 = QToolBarLayout::indexOf
                        (*(QToolBarLayout **)(lVar2 + 0x278),*(QAction **)(event + 0x18));
    }
    QToolBarLayout::insertAction(*(QToolBarLayout **)(lVar2 + 0x278),iVar3,action);
    return;
  }
  return;
}

Assistant:

void QToolBar::actionEvent(QActionEvent *event)
{
    Q_D(QToolBar);
    auto action = static_cast<QAction *>(event->action());
    QWidgetAction *widgetAction = qobject_cast<QWidgetAction *>(action);

    switch (event->type()) {
        case QEvent::ActionAdded: {
            Q_ASSERT_X(widgetAction == nullptr || d->layout->indexOf(widgetAction) == -1,
                        "QToolBar", "widgets cannot be inserted multiple times");

            // reparent the action to this toolbar if it has been created
            // using the addAction(text) etc. convenience functions, to
            // preserve Qt 4.1.x behavior. The widget is already
            // reparented to us due to the createWidget call inside
            // createItem()
            if (widgetAction != nullptr && widgetAction->d_func()->autoCreated)
                widgetAction->setParent(this);

            int index = d->layout->count();
            if (event->before()) {
                index = d->layout->indexOf(event->before());
                Q_ASSERT_X(index != -1, "QToolBar::insertAction", "internal error");
            }
            d->layout->insertAction(index, action);
            break;
        }

        case QEvent::ActionChanged:
            d->layout->invalidate();
            break;

        case QEvent::ActionRemoved: {
            int index = d->layout->indexOf(action);
            if (index != -1) {
                delete d->layout->takeAt(index);
            }
            break;
        }

        default:
            Q_ASSERT_X(false, "QToolBar::actionEvent", "internal error");
    }
}